

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPolicies.cxx
# Opt level: O2

void __thiscall cmPolicies::PolicyMap::Set(PolicyMap *this,PolicyID id,PolicyStatus status)

{
  uint uVar1;
  reference local_30;
  
  local_30._M_wp = (this->Status).super__Base_bitset<4UL>._M_w + ((ulong)(long)(int)(id * 3) >> 6);
  local_30._M_bpos = (size_t)(id * 3 & 0x3f);
  std::bitset<216UL>::reference::operator=(&local_30,status == OLD);
  uVar1 = id * 3 + 1;
  local_30._M_wp = (this->Status).super__Base_bitset<4UL>._M_w + ((ulong)(long)(int)uVar1 >> 6);
  local_30._M_bpos = (size_t)(uVar1 & 0x3f);
  std::bitset<216UL>::reference::operator=(&local_30,status == WARN);
  uVar1 = id * 3 + 2;
  local_30._M_wp = (this->Status).super__Base_bitset<4UL>._M_w + ((ulong)(long)(int)uVar1 >> 6);
  local_30._M_bpos = (size_t)(uVar1 & 0x3f);
  std::bitset<216UL>::reference::operator=(&local_30,status == NEW);
  return;
}

Assistant:

void cmPolicies::PolicyMap::Set(cmPolicies::PolicyID id,
                                cmPolicies::PolicyStatus status)
{
  this->Status[(POLICY_STATUS_COUNT * id) + OLD] = (status == OLD);
  this->Status[(POLICY_STATUS_COUNT * id) + WARN] = (status == WARN);
  this->Status[(POLICY_STATUS_COUNT * id) + NEW] = (status == NEW);
}